

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall
Json::OurReader::parse(OurReader *this,char *beginDoc,char *endDoc,Value *root,bool collectComments)

{
  iterator *piVar1;
  _Elt_pointer ppVVar2;
  size_type sVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  Token token;
  undefined1 local_88 [32];
  Token local_68;
  String local_50;
  
  bVar5 = (this->features_).allowComments_;
  this->begin_ = beginDoc;
  this->end_ = endDoc;
  this->collectComments_ = (bool)(collectComments & bVar5);
  this->current_ = beginDoc;
  (this->commentsBefore_)._M_string_length = 0;
  this->lastValueEnd_ = (Location)0x0;
  this->lastValue_ = (Value *)0x0;
  *(this->commentsBefore_)._M_dataplus._M_p = '\0';
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::clear
            (&this->errors_);
  while (ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur,
        ppVVar2 !=
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
    std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
              ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  }
  local_88._0_8_ = root;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
              ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_88);
  }
  else {
    *ppVVar2 = root;
    piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  bVar5 = readValue(this);
  std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
            ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
  skipCommentTokens(this,&local_68);
  if (((this->features_).failIfExtra_ == true) && (local_68.type_ != tokenEndOfStream)) {
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Extra non-whitespace after JSON value.","");
    addError(this,(String *)local_88,&local_68,(Location)0x0);
  }
  else {
    if ((this->collectComments_ == true) &&
       (sVar3 = (this->commentsBefore_)._M_string_length, sVar3 != 0)) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar4 = (this->commentsBefore_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar4,pcVar4 + sVar3);
      Value::setComment(root,&local_50,commentAfter);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((this->features_).strictRoot_ != true) {
      return bVar5;
    }
    bVar6 = Value::isArray(root);
    if (bVar6) {
      return bVar5;
    }
    bVar6 = Value::isObject(root);
    if (bVar6) {
      return bVar5;
    }
    local_68.type_ = tokenError;
    local_88._0_8_ = local_88 + 0x10;
    local_68.start_ = beginDoc;
    local_68.end_ = endDoc;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,
               "A valid JSON document must be either an array or an object value.","");
    addError(this,(String *)local_88,&local_68,(Location)0x0);
  }
  if ((Value *)local_88._0_8_ != (Value *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  return false;
}

Assistant:

bool OurReader::parse(const char* beginDoc,
                      const char* endDoc,
                      Value& root,
                      bool collectComments) {
  if (!features_.allowComments_) {
    collectComments = false;
  }

  begin_ = beginDoc;
  end_ = endDoc;
  collectComments_ = collectComments;
  current_ = begin_;
  lastValueEnd_ = nullptr;
  lastValue_ = nullptr;
  commentsBefore_.clear();
  errors_.clear();
  while (!nodes_.empty())
    nodes_.pop();
  nodes_.push(&root);

  bool successful = readValue();
  nodes_.pop();
  Token token;
  skipCommentTokens(token);
  if (features_.failIfExtra_ && (token.type_ != tokenEndOfStream)) {
    addError("Extra non-whitespace after JSON value.", token);
    return false;
  }
  if (collectComments_ && !commentsBefore_.empty())
    root.setComment(commentsBefore_, commentAfter);
  if (features_.strictRoot_) {
    if (!root.isArray() && !root.isObject()) {
      // Set error location to start of doc, ideally should be first token found
      // in doc
      token.type_ = tokenError;
      token.start_ = beginDoc;
      token.end_ = endDoc;
      addError(
          "A valid JSON document must be either an array or an object value.",
          token);
      return false;
    }
  }
  return successful;
}